

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O2

void __thiscall re2c::Linear::~Linear(Linear *this)

{
  pointer ppVar1;
  Cond *this_00;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppVar1 = (this->branches).
             super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->branches).
                      super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <=
        (ulong)uVar2) break;
    this_00 = ppVar1[uVar2].first;
    if (this_00 != (Cond *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00,0x28);
    uVar2 = uVar2 + 1;
  }
  std::
  _Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
                   *)this);
  return;
}

Assistant:

Linear::~Linear ()
{
	for (uint32_t i = 0; i < branches.size (); ++i)
	{
		delete branches[i].first;
	}
}